

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

bool ReadObject(HSQUIRRELVM v,SQUserPointer up,SQREADFUNC read,SQObjectPtr *o)

{
  SQSharedState *ss;
  SQObjectPtr *read_00;
  SQREADFUNC up_00;
  SQUserPointer pvVar1;
  bool bVar2;
  SQChar *pSVar3;
  SQString *x;
  SQFloat local_54;
  SQObjectValue SStack_50;
  SQFloat f;
  SQInteger i_1;
  SQInteger i;
  SQInteger len;
  SQObjectType t;
  SQUnsignedInteger32 _type;
  SQObjectPtr *o_local;
  SQREADFUNC read_local;
  SQUserPointer up_local;
  HSQUIRRELVM v_local;
  
  _t = o;
  o_local = (SQObjectPtr *)read;
  read_local = (SQREADFUNC)up;
  up_local = v;
  bVar2 = SafeRead(v,read,up,(SQUserPointer)((long)&len + 4),4);
  pvVar1 = up_local;
  if (!bVar2) {
    return false;
  }
  len._0_4_ = len._4_4_;
  if (len._4_4_ == OT_NULL) {
    SQObjectPtr::Null(_t);
  }
  else if (len._4_4_ == OT_BOOL) {
    bVar2 = SafeRead((HSQUIRRELVM)up_local,(SQWRITEFUNC)o_local,read_local,&stack0xffffffffffffffb0,
                     8);
    if (!bVar2) {
      return false;
    }
    (_t->super_SQObject)._type = OT_BOOL;
    (_t->super_SQObject)._unVal = SStack_50;
  }
  else if (len._4_4_ == OT_INTEGER) {
    bVar2 = SafeRead((HSQUIRRELVM)up_local,(SQWRITEFUNC)o_local,read_local,&i_1,8);
    if (!bVar2) {
      return false;
    }
    SQObjectPtr::operator=(_t,i_1);
  }
  else if (len._4_4_ == OT_FLOAT) {
    bVar2 = SafeRead((HSQUIRRELVM)up_local,(SQWRITEFUNC)o_local,read_local,&local_54,4);
    if (!bVar2) {
      return false;
    }
    SQObjectPtr::operator=(_t,local_54);
  }
  else {
    if (len._4_4_ != OT_STRING) {
      pSVar3 = IdType2Name(len._4_4_);
      SQVM::Raise_Error((SQVM *)pvVar1,"cannot serialize a %s",pSVar3);
      return false;
    }
    bVar2 = SafeRead((HSQUIRRELVM)up_local,(SQWRITEFUNC)o_local,read_local,&i,8);
    pvVar1 = up_local;
    up_00 = read_local;
    read_00 = o_local;
    if (!bVar2) {
      return false;
    }
    pSVar3 = SQSharedState::GetScratchPad(*(SQSharedState **)((long)up_local + 0x118),i);
    bVar2 = SafeRead((HSQUIRRELVM)pvVar1,(SQWRITEFUNC)read_00,up_00,pSVar3,i);
    if (!bVar2) {
      return false;
    }
    ss = *(SQSharedState **)((long)up_local + 0x118);
    pSVar3 = SQSharedState::GetScratchPad(*(SQSharedState **)((long)up_local + 0x118),-1);
    x = SQString::Create(ss,pSVar3,i);
    SQObjectPtr::operator=(_t,x);
  }
  return true;
}

Assistant:

bool ReadObject(HSQUIRRELVM v,SQUserPointer up,SQREADFUNC read,SQObjectPtr &o)
{
    SQUnsignedInteger32 _type;
    _CHECK_IO(SafeRead(v,read,up,&_type,sizeof(_type)));
    SQObjectType t = (SQObjectType)_type;
    switch(t){
    case OT_STRING:{
        SQInteger len;
        _CHECK_IO(SafeRead(v,read,up,&len,sizeof(SQInteger)));
        _CHECK_IO(SafeRead(v,read,up,_ss(v)->GetScratchPad(sq_rsl(len)),sq_rsl(len)));
        o=SQString::Create(_ss(v),_ss(v)->GetScratchPad(-1),len);
                   }
        break;
    case OT_INTEGER:{
        SQInteger i;
        _CHECK_IO(SafeRead(v,read,up,&i,sizeof(SQInteger))); o = i; break;
                    }
    case OT_BOOL:{
        SQInteger i;
        _CHECK_IO(SafeRead(v,read,up,&i,sizeof(SQInteger))); o._type = OT_BOOL; o._unVal.nInteger = i; break;
                    }
    case OT_FLOAT:{
        SQFloat f;
        _CHECK_IO(SafeRead(v,read,up,&f,sizeof(SQFloat))); o = f; break;
                  }
    case OT_NULL:
        o.Null();
        break;
    default:
        v->Raise_Error(_SC("cannot serialize a %s"),IdType2Name(t));
        return false;
    }
    return true;
}